

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O1

cell_index_t
itree_add_tri(itree_t *t,cell_id_t left_context,cell_id_t right_context,cell_id_t posn,
             cell_id_t tri_id)

{
  cell_t *pcVar1;
  uint uVar2;
  cell_index_t cVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  pcVar1 = t->cell;
  if (pcVar1->id == 0xffffffff) {
    uVar4 = 0xffffffff;
LAB_00122b48:
    uVar6 = 0;
  }
  else if (pcVar1->id == left_context) {
    uVar4 = 0;
    uVar6 = 0xffffffff;
  }
  else {
    uVar4 = pcVar1->sib;
    if (uVar4 == 0xffffffff) goto LAB_00122b48;
    uVar6 = 0;
    do {
      uVar2 = uVar4;
      uVar4 = uVar2;
      if (pcVar1[uVar2].id == left_context) break;
      uVar4 = pcVar1[uVar2].sib;
      uVar6 = uVar2;
    } while (uVar4 != 0xffffffff);
  }
  if (uVar4 == 0xffffffff) {
    cVar3 = itree_add_sib(t,uVar6,left_context);
    cVar3 = itree_add_child(t,cVar3,right_context);
  }
  else {
    uVar4 = pcVar1[uVar4].child;
    uVar5 = (ulong)uVar4;
    if (pcVar1[uVar5].id == 0xffffffff) {
      uVar6 = 0xffffffff;
      cVar3 = uVar4;
    }
    else {
      uVar6 = uVar4;
      cVar3 = 0xffffffff;
      if ((uVar4 != 0xffffffff) && (pcVar1[uVar5].id != right_context)) {
        uVar6 = pcVar1[uVar5].sib;
        for (; cVar3 = uVar4, uVar6 != 0xffffffff; uVar6 = pcVar1[uVar6].sib) {
          uVar7 = (ulong)uVar6;
          if (pcVar1[uVar6].id == right_context) {
            cVar3 = (cell_index_t)uVar5;
            break;
          }
          uVar4 = uVar6;
          uVar5 = uVar7;
        }
      }
    }
    if (uVar6 != 0xffffffff) {
      uVar4 = pcVar1[uVar6].child;
      uVar5 = (ulong)uVar4;
      if (pcVar1[uVar5].id == 0xffffffff) {
        uVar6 = 0xffffffff;
        cVar3 = uVar4;
      }
      else {
        uVar6 = uVar4;
        cVar3 = 0xffffffff;
        if ((uVar4 != 0xffffffff) && (pcVar1[uVar5].id != posn)) {
          uVar6 = pcVar1[uVar5].sib;
          for (; cVar3 = uVar4, uVar6 != 0xffffffff; uVar6 = pcVar1[uVar6].sib) {
            uVar7 = (ulong)uVar6;
            if (pcVar1[uVar6].id == posn) {
              cVar3 = (cell_index_t)uVar5;
              break;
            }
            uVar4 = uVar6;
            uVar5 = uVar7;
          }
        }
      }
      if (uVar6 != 0xffffffff) {
        return uVar6;
      }
      uVar4 = itree_add_sib(t,cVar3,posn);
      goto LAB_00122bdc;
    }
    cVar3 = itree_add_sib(t,cVar3,right_context);
  }
  uVar4 = itree_add_child(t,cVar3,posn);
LAB_00122bdc:
  t->cell[uVar4].child = tri_id;
  return uVar4;
}

Assistant:

cell_id_t
itree_add_tri(itree_t *t,
	      cell_id_t left_context,
	      cell_id_t right_context,
	      cell_id_t posn,
	      cell_id_t tri_id)
{
    cell_index_t end;
    cell_index_t parent;

    parent = itree_find(t, &end, 0, left_context);
    if (parent == NULL_INDEX) {
	parent = itree_add_sib(t, end, left_context);
	parent = itree_add_child(t, parent, right_context);
	parent = itree_add_child(t, parent, posn);

	t->cell[parent].child = tri_id;

	return parent;
    }

    parent = itree_find(t, &end, t->cell[parent].child, right_context);
    if (parent == NULL_INDEX) {
	parent = itree_add_sib(t, end, right_context);
	parent = itree_add_child(t, parent, posn);

	t->cell[parent].child = tri_id;

	return parent;
    }
    
    parent = itree_find(t, &end, t->cell[parent].child, posn);
    if (parent == NULL_INDEX) {
	parent = itree_add_sib(t, end, posn);
	
	t->cell[parent].child = tri_id;

	return parent;
    }

    return parent;
}